

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
SModeIRCCommand::trigger
          (SModeIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  const_iterator __begin1;
  long *plVar5;
  string local_68;
  long *local_48;
  long *local_40;
  long local_38;
  
  pcVar2 = channel._M_str;
  sVar3 = channel._M_len;
  if (parameters._M_len != 0) {
    lVar1 = Jupiter::IRC::Client::getChannel(source,sVar3,pcVar2);
    if (lVar1 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&local_48);
      if (local_48 == local_40) {
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      else {
        uVar4 = 0;
        plVar5 = local_48;
        do {
          if (*plVar5 != 0) {
            lVar1 = RenX::Server::getPlayerByPartName(*plVar5,parameters._M_len,parameters._M_str);
            if (lVar1 != 0) {
              RenX::Server::smodePlayer((PlayerInfo *)*plVar5);
              uVar4 = uVar4 + 1;
            }
          }
          plVar5 = plVar5 + 1;
        } while (plVar5 != local_40);
        string_printf_abi_cxx11_(&local_68,"%u players smoded.",(ulong)uVar4);
        Jupiter::IRC::Client::sendMessage
                  (source,sVar3,pcVar2,local_68._M_string_length,local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_48 != (long *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,nick._M_len,nick._M_str,0x31,"Error: Too Few Parameters. Syntax: smode <Player>"
            );
  return;
}

Assistant:

void SModeIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: smode <Player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	RenX::PlayerInfo *player;
	unsigned int smodes = 0;
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(parameters);
			if (player != nullptr) {
				server->smodePlayer(*player);
				++smodes;
			}
		}
	}
	source->sendMessage(channel, string_printf("%u players smoded.", smodes));
}